

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt8 value)

{
  deInt8 val;
  
  val = value ^ 0x4b;
  SeedBuilder::feed(builder,1,&val);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt8 value)
{
	const deInt8 val = value ^ 75;

	builder.feed(sizeof(val), &val);
	return builder;
}